

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char *__rhs;
  float *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  value = (float *)((long)this + 4);
  for (lVar1 = 0; lVar1 < *(int *)((long)this + 0xc); lVar1 = lVar1 + 1) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    __rhs = " or ";
    if (lVar1 == 0) {
      __rhs = "";
    }
    std::operator+(&local_d0,&local_f0,__rhs);
    std::operator+(&local_90,&local_d0,
                   _ZZNK3vkt12tessellation12_GLOBAL__N_120OuterEdgeDescription11descriptionB5cxx11EvE15coordinateNames_rel
                   + *(int *)(
                             _ZZNK3vkt12tessellation12_GLOBAL__N_120OuterEdgeDescription11descriptionB5cxx11EvE15coordinateNames_rel
                             + (long)*this * 4));
    std::operator+(&local_70,&local_90,"=");
    de::toString<float>(&local_b0,value);
    std::operator+(&local_50,&local_70,&local_b0);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    value = value + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline bool contains (const ContainerT& c, const T& key)
{
	return c.find(key) != c.end();
}